

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int raviV_check_usertype(lua_State *L,TString *name,TValue *o)

{
  lua_CFunction p_Var1;
  TKey *pTVar2;
  byte local_71;
  TValue *metatab;
  Table *reg;
  Table *mt;
  TValue *o_local;
  TString *name_local;
  lua_State *L_local;
  int nx;
  TValue *k;
  Node *n;
  Node *local_10;
  
  switch(o->tt_ & 0x7f) {
  case 5:
    if (o->tt_ != 0x8005) {
      __assert_fail("((((o))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d3,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    if (((o->value_).gc)->tt != '\x05') {
      __assert_fail("(((o)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d3,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    reg = *(Table **)((o->value_).f + 0x28);
    break;
  default:
    reg = (Table *)0x0;
    break;
  case 7:
    if (o->tt_ != 0x8007) {
      __assert_fail("((((o))->tt_) == (((7) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d6,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    if (((o->value_).gc)->tt != '\a') {
      __assert_fail("(((o)->value_).gc)->tt == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d6,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    reg = *(Table **)((o->value_).f + 0x10);
    break;
  case 0x15:
  case 0x25:
    if ((o->tt_ != 0x8015) && (o->tt_ != 0x8025)) {
      __assert_fail("(((((o))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((o))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d0,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    if ((((o->value_).gc)->tt != '\x15') && (((o->value_).gc)->tt != '%')) {
      __assert_fail("((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d0,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    reg = *(Table **)((o->value_).f + 0x38);
  }
  if (reg == (Table *)0x0) {
    return 0;
  }
  if ((L->l_G->l_registry).tt_ != 0x8005) {
    __assert_fail("((((&(L->l_G)->l_registry))->tt_) == (((5) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x4de,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
  }
  if (((L->l_G->l_registry).value_.gc)->tt != '\x05') {
    __assert_fail("(((&(L->l_G)->l_registry)->value_).gc)->tt == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x4de,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
  }
  p_Var1 = (L->l_G->l_registry).value_.f;
  local_10 = (Node *)(*(long *)(p_Var1 + 0x18) +
                     (ulong)(name->hash & *(uint *)(p_Var1 + 0x38)) * 0x20);
  if (name->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  pTVar2 = &local_10->i_key;
  if ((local_10->i_key).nk.tt_ == 0x8004) {
    if (((local_10->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar2->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((pTVar2->nk).value_.gc)->tt != '\x04') {
      __assert_fail("((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((local_10->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar2->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((TString *)(pTVar2->nk).value_.gc != name) goto LAB_00148503;
  }
  else {
LAB_00148503:
    if ((local_10->i_key).nk.next == 0) {
      local_10 = (Node *)&luaO_nilobject_;
    }
    else {
      local_10 = (Node *)luaH_getshortstr_continue(name,local_10);
    }
  }
  if (((local_10->i_val).tt_ != 0) && ((local_10->i_val).tt_ == 0x8005)) {
    if ((local_10->i_val).tt_ != 0x8005) {
      __assert_fail("((((metatab))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4e0,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    if (((local_10->i_val).value_.gc)->tt != '\x05') {
      __assert_fail("(((metatab)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4e0,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    local_71 = 1;
    if ((Table *)(local_10->i_val).value_.gc == reg) goto LAB_001485d3;
  }
  local_71 = 0;
LAB_001485d3:
  return (uint)local_71;
}

Assistant:

int raviV_check_usertype(lua_State *L, TString *name, const TValue *o)
{
  Table *mt;
  switch (ttype(o)) {
  case RAVI_TIARRAY:
  case RAVI_TFARRAY:
    mt = arrvalue(o)->metatable;
    break;
  case LUA_TTABLE:
    mt = hvalue(o)->metatable;
    break;
  case LUA_TUSERDATA:
    mt = uvalue(o)->metatable;
    break;
  default:
    mt = NULL;
  }
  if (mt == NULL)
    return 0;
  /* get global table from registry */
  Table *reg = hvalue(&G(L)->l_registry);
  const TValue *metatab = luaH_getshortstr(reg, name);
  return (!ttisnil(metatab) && ttisLtable(metatab) && hvalue(metatab) == mt) || 0;
}